

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutengine_p.h
# Opt level: O0

void qMaxExpCalc(int *max,bool *exp,bool *empty,int boxmax,bool boxexp,bool boxempty)

{
  byte bVar1;
  int *piVar2;
  byte bVar3;
  int in_ECX;
  byte *in_RDX;
  byte *in_RSI;
  int *in_RDI;
  byte in_R8B;
  byte in_R9B;
  long in_FS_OFFSET;
  byte local_4a;
  byte local_49;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = in_R8B & 1;
  bVar1 = in_R9B & 1;
  if ((*in_RSI & 1) == 0) {
    if ((bVar3 == 0) && (((*in_RDX & 1) == 0 || ((bVar1 != 0 && (*in_RDI != 0)))))) {
      if ((*in_RDX & 1) == bVar1) {
        piVar2 = qMin<int>(in_RDI,&local_c);
        *in_RDI = *piVar2;
      }
    }
    else {
      *in_RDI = in_ECX;
    }
  }
  else if (bVar3 != 0) {
    piVar2 = qMax<int>(in_RDI,&local_c);
    *in_RDI = *piVar2;
  }
  local_49 = 1;
  if ((*in_RSI & 1) == 0) {
    local_49 = bVar3;
  }
  *in_RSI = local_49;
  local_4a = 0;
  if ((*in_RDX & 1) != 0) {
    local_4a = bVar1;
  }
  *in_RDX = local_4a;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static inline void qMaxExpCalc(int & max, bool &exp, bool &empty,
                               int boxmax, bool boxexp, bool boxempty)
{
    if (exp) {
        if (boxexp)
            max = qMax(max, boxmax);
    } else {
        if (boxexp || (empty && (!boxempty || max == 0)))
            max = boxmax;
        else if (empty == boxempty)
            max = qMin(max, boxmax);
    }
    exp = exp || boxexp;
    empty = empty && boxempty;
}